

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O3

void __thiscall UnixMakefileGenerator::init2(UnixMakefileGenerator *this)

{
  QMakeProject **ppQVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char (*pacVar6) [4];
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  QList<ProString> *pQVar14;
  ProStringList *pPVar15;
  iterator iVar16;
  ProString *pPVar17;
  QString *str;
  pointer this_00;
  QMovableArrayOps<ProString> *pQVar18;
  QArrayDataPointer<ProString> *pQVar19;
  QArrayDataPointer<ProString> *pQVar20;
  qsizetype qVar21;
  ProStringList *pPVar22;
  char *pcVar23;
  QMakeProject *pQVar24;
  long in_FS_OFFSET;
  QByteArrayView QVar25;
  QLatin1String QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QLatin1String other;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QLatin1String other_00;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QStringView config_08;
  QStringView config_09;
  QStringView config_10;
  QStringView config_11;
  QStringView config_12;
  QStringView config_13;
  QStringView config_14;
  QStringView config_15;
  QStringView config_16;
  QLatin1String QVar40;
  ProString bundle_loc_1;
  ProString soname;
  ProString bundle_loc;
  ProString MD_flag;
  QList<ProString> *local_848;
  ProKey local_838;
  ProString local_808;
  ProKey local_7d8;
  ProString local_7a8;
  undefined1 local_778 [16];
  qsizetype local_768;
  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]> local_738;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
  local_6f8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
  local_688;
  undefined1 local_608 [40];
  undefined1 *puStack_5e0;
  ProString local_5d8 [2];
  undefined1 local_558 [40];
  undefined1 *puStack_530;
  ProString local_528;
  char (*local_4f8) [2];
  char (*local_4b0) [2];
  undefined1 local_4a8 [224];
  undefined1 local_3c8 [40];
  undefined1 *puStack_3a0;
  undefined1 local_398 [48];
  Data *local_368;
  ProString *local_360;
  char (*local_338) [2];
  Data *local_330;
  char (*local_320) [2];
  undefined1 local_2d8 [40];
  undefined1 *puStack_2b0;
  undefined1 local_2a8 [16];
  ProString local_298;
  char (*local_248) [2];
  undefined1 local_240 [136];
  ProKey local_1b8;
  ProString local_188;
  ProKey local_158;
  ProString local_128;
  ProString local_f8;
  ProString local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar24 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_2d8,"QMAKE_FRAMEWORK_VERSION");
  bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
  if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_2d8._0_8_)->d).d = *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  ppQVar1 = &(this->super_MakefileGenerator).project;
  if (bVar11) {
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_FRAMEWORK_VERSION");
    pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
               super_QList<ProString>;
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_4a8,"VER_MAJ");
    QMakeEvaluator::first((ProString *)local_3c8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8)
    ;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_3c8);
    QList<ProString>::end(pQVar14);
    if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_3c8._0_8_)->d).d =
           *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_4a8._0_8_)->d).d =
           *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_2d8._0_8_)->d).d =
           *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
  }
  pQVar24 = *ppQVar1;
  ProKey::ProKey((ProKey *)local_3c8,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_2d8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
  bVar11 = ProString::operator==((ProString *)local_2d8,"aux");
  if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_2d8._0_8_)->d).d = *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_3c8._0_8_)->d).d = *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if (bVar11) {
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_558,"QMAKE_PREFIX_STATICLIB");
    QMakeEvaluator::first((ProString *)local_4a8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)
    ;
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_688,"TARGET");
    QMakeEvaluator::first
              ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688);
    ProString::ProString((ProString *)local_2d8,(ProString *)local_4a8);
    ProString::ProString((ProString *)local_2a8,(ProString *)local_608);
    ProString::ProString<ProString,ProString>
              ((ProString *)local_3c8,(QStringBuilder<ProString,_ProString> *)local_2d8);
    local_768 = 0;
    local_778._0_8_ = (Data *)0x0;
    local_778._8_8_ = (ProString *)0x0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)local_778,0,(ProString *)local_3c8);
    QList<ProString>::end((QList<ProString> *)local_778);
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)&local_6f8,"PRL_TARGET");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_6f8);
    qVar21 = local_768;
    uVar5 = local_778._8_8_;
    uVar4 = local_778._0_8_;
    local_768 = 0;
    local_778._0_8_ = (QArrayData *)0x0;
    local_778._8_8_ = (ProString *)0x0;
    local_738.a.a = (char (*) [4])(pPVar15->super_QList<ProString>).d.d;
    local_738.a.b.m_string.d.d = (Data *)(pPVar15->super_QList<ProString>).d.ptr;
    (pPVar15->super_QList<ProString>).d.d = (Data *)uVar4;
    (pPVar15->super_QList<ProString>).d.ptr = (ProString *)uVar5;
    local_738.a.b.m_string.d.ptr = (char16_t *)(pPVar15->super_QList<ProString>).d.size;
    (pPVar15->super_QList<ProString>).d.size = qVar21;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_738);
    if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
           *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_778);
    if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_3c8._0_8_)->d).d =
           *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    QStringBuilder<ProString,_ProString>::~QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)local_2d8);
    if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_608._0_8_)->d).d =
           *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
           *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
      }
    }
    if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_4a8._0_8_)->d).d =
           *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_558._0_8_ == (ProString *)0x0) goto LAB_001d694f;
    LOCK();
    ((__atomic_base<int> *)&(((QString *)local_558._0_8_)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)local_558._0_8_)->d).d)->_M_i + -1;
    iVar2 = ((__atomic_base<int> *)&(((QString *)local_558._0_8_)->d).d)->_M_i;
    UNLOCK();
    pPVar17 = (ProString *)local_558._0_8_;
joined_r0x001d775d:
    if (iVar2 == 0) {
      QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
    }
  }
  else {
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_APP_FLAG");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
    lVar3 = (pPVar15->super_QList<ProString>).d.size;
    if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_2d8._0_8_)->d).d =
           *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
    pQVar24 = *ppQVar1;
    if (lVar3 == 0) {
      QVar25.m_data = (storage_type *)0x9;
      QVar25.m_size = (qsizetype)local_2d8;
      QString::fromUtf8(QVar25);
      uVar4 = local_2d8._0_8_;
      config.m_data = (storage_type_conflict *)local_2d8._8_8_;
      config.m_size = local_2d8._16_8_;
      bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config,false);
      if ((ProString *)uVar4 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)uVar4)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
        }
      }
      if (bVar11) {
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"TARGET");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
                   super_QList<ProString>;
        iVar16 = QList<ProString>::begin(pQVar14);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"QMAKE_PREFIX_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8);
        pPVar17 = ProString::prepend(iVar16.i,(ProString *)local_3c8);
        local_688.a.a.a.a = (char (*) [4])0x0;
        local_688.a.a.a.b.m_string.d.d = (Data *)0x0;
        local_688.a.a.a.b.m_string.d.ptr = (char16_t *)0x0;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)&local_688,0,pPVar17);
        QList<ProString>::end((QList<ProString> *)&local_688);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_558,"PRL_TARGET");
        pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_558);
        pcVar8 = local_688.a.a.a.b.m_string.d.ptr;
        pDVar7 = local_688.a.a.a.b.m_string.d.d;
        pacVar6 = local_688.a.a.a.a;
        local_688.a.a.a.b.m_string.d.ptr = (char16_t *)0x0;
        local_688.a.a.a.a = (char (*) [4])0x0;
        local_688.a.a.a.b.m_string.d.d = (Data *)0x0;
        local_608._0_8_ = (pPVar15->super_QList<ProString>).d.d;
        local_608._8_8_ = (pPVar15->super_QList<ProString>).d.ptr;
        (pPVar15->super_QList<ProString>).d.d = (Data *)pacVar6;
        (pPVar15->super_QList<ProString>).d.ptr = (ProString *)pDVar7;
        local_608._16_8_ = (pPVar15->super_QList<ProString>).d.size;
        (pPVar15->super_QList<ProString>).d.size = (qsizetype)pcVar8;
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_608);
        if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_558._0_8_)->d).d =
               *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_688)
        ;
        if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_3c8._0_8_)->d).d =
               *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_4a8._0_8_)->d).d =
               *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"QMAKE_EXTENSION_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8);
        local_2d8._0_8_ = ".";
        ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_3c8);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_558,"TARGET");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)->
                   super_QList<ProString>;
        iVar16 = QList<ProString>::begin(pQVar14);
        ProString::operator+=(iVar16.i,(QStringBuilder<const_char_(&)[2],_ProString> *)local_2d8);
        if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_558._0_8_)->d).d =
               *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
          }
        }
        if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_3c8._0_8_)->d).d =
               *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_4a8._0_8_)->d).d =
               *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AR_CMD");
        pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
        lVar3 = (pPVar15->super_QList<ProString>).d.size;
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (lVar3 == 0) {
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AR_CMD");
          pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
                     super_QList<ProString>;
          ProString::ProString((ProString *)local_3c8,"$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_3c8
                    );
          QList<ProString>::end(pQVar14);
          if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                 *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          goto joined_r0x001d0a36;
        }
      }
      else {
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_608,"TARGETA");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_608)->
                   super_QList<ProString>;
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_738,"DESTDIR");
        QMakeEvaluator::first
                  ((ProString *)&local_6f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_PREFIX_STATICLIB");
        QMakeEvaluator::first
                  ((ProString *)local_778,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68);
        ProString::ProString((ProString *)local_558,(ProString *)&local_6f8);
        ProString::ProString(&local_528,(ProString *)local_778);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_c8,"TARGET");
        QMakeEvaluator::first(&local_98,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_c8);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_4a8,
                   (QStringBuilder<ProString,_ProString> *)local_558,&local_98);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_3c8,
                   (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_4a8);
        local_338 = (char (*) [2])0x2b73ae;
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_128,"QMAKE_EXTENSION_STATICLIB");
        QMakeEvaluator::first(&local_f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_128);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_2d8,
                   (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_3c8);
        local_248 = local_338;
        ProString::ProString((ProString *)local_240,&local_f8);
        ProString::
        ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char_const(&)[2]>,ProString>
                  ((ProString *)&local_688,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)local_2d8);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)&local_688)
        ;
        QList<ProString>::end(pQVar14);
        if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
               *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8);
        if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_3c8);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)local_4a8);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)local_558);
        if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
               *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
          }
        }
        if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
          }
        }
        if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_608._0_8_)->d).d =
               *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
          }
        }
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AR_CMD");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
                   super_QList<ProString>;
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if ((pQVar14->d).size == 0) {
          ProString::ProString((ProString *)local_2d8,"$(AR) $(TARGETA) $(OBJECTS)");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_2d8
                    );
          QList<ProString>::end(pQVar14);
          if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i;
            UNLOCK();
            pPVar17 = (ProString *)local_2d8._0_8_;
            goto joined_r0x001d0f02;
          }
        }
        else {
          ProString::toQString((QString *)local_3c8,(pQVar14->d).ptr);
          QVar26.m_data = &DAT_00000008;
          QVar26.m_size = (qsizetype)local_3c8;
          QVar40.m_data = (char *)0x9;
          QVar40.m_size = (qsizetype)"(TARGET)";
          str = (QString *)QString::replace(QVar26,QVar40,0x2af077);
          ProString::ProString((ProString *)local_2d8,str);
          this_00 = QList<ProString>::data(pQVar14);
          QString::operator=(&this_00->m_string,(QString *)local_2d8);
          this_00->m_hash = (size_t)puStack_2b0;
          this_00->m_offset = local_2d8._24_4_;
          this_00->m_length = local_2d8._28_4_;
          *(undefined8 *)&this_00->m_file = local_2d8._32_8_;
          if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                 *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i;
            UNLOCK();
            pPVar17 = (ProString *)local_3c8._0_8_;
joined_r0x001d0f02:
            if (iVar2 == 0) {
              QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
            }
          }
        }
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE");
        bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        pQVar24 = *ppQVar1;
        if (bVar11) {
          QVar27.m_data = (storage_type *)0x6;
          QVar27.m_size = (qsizetype)local_2d8;
          QString::fromUtf8(QVar27);
          uVar4 = local_2d8._0_8_;
          config_00.m_data = (storage_type_conflict *)local_2d8._8_8_;
          config_00.m_size = local_2d8._16_8_;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_00,false);
          if ((ProString *)uVar4 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar4)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
            }
          }
          if (bVar11) {
            local_128.m_string.d.d = (Data *)0x0;
            local_128.m_string.d.ptr = (char16_t *)0x0;
            local_128.m_string.d.size = 0;
            pQVar24 = *ppQVar1;
            QVar28.m_data = (storage_type *)0x15;
            QVar28.m_size = (qsizetype)local_2d8;
            QString::fromUtf8(QVar28);
            config_01.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_01.m_size = local_2d8._16_8_;
            bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_01,false);
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (!bVar11) {
              QVar29.m_size = (size_t)"lib";
              QVar29.field_0.m_data = &local_128;
              QString::assign(QVar29);
            }
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
            pQVar18 = (QMovableArrayOps<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_608,"TARGET");
            QMakeEvaluator::first
                      ((ProString *)local_558,&pQVar24->super_QMakeEvaluator,(ProKey *)local_608);
            local_2d8._0_8_ = &local_128;
            ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
            ProString::ProString<QString&,ProString>
                      ((ProString *)local_4a8,(QStringBuilder<QString_&,_ProString> *)local_2d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      (pQVar18,0,(ProString *)local_4a8);
            if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                   *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
              }
            }
            if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_558._0_8_)->d).d =
                   *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_608._0_8_)->d).d =
                   *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                   *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_558,"TARGET_x.y.z");
            pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)
                       ->super_QList<ProString>;
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
            QMakeEvaluator::first
                      ((ProString *)&local_688,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_6f8);
            local_4a8._0_8_ = &local_128;
            ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
            local_3c8._0_8_ = local_4a8._0_8_;
            ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
            local_398._8_8_ = ".";
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_778,"QMAKE_EXTENSION_PLUGIN");
            QMakeEvaluator::first
                      ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,(ProKey *)local_778);
            local_2d8._0_8_ = local_3c8._0_8_;
            ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)(local_3c8 + 8));
            local_2a8._8_8_ = local_398._8_8_;
            ProString::ProString(&local_298,(ProString *)&local_738);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>
                      ((ProString *)local_608,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)local_2d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,
                       (ProString *)local_608);
            QList<ProString>::end(pQVar14);
            if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_608._0_8_)->d).d =
                   *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_2d8);
            if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
              }
            }
            if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                   *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
              }
            }
            if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                   *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_558._0_8_)->d).d =
                   *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
              }
            }
            pQVar24 = *ppQVar1;
            QVar30.m_data = (storage_type *)0x11;
            QVar30.m_size = (qsizetype)local_2d8;
            QString::fromUtf8(QVar30);
            uVar4 = local_2d8._0_8_;
            config_02.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_02.m_size = local_2d8._16_8_;
            bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_02,false);
            if ((ProString *)uVar4 != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar4)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
              }
            }
            pQVar24 = *ppQVar1;
            if (bVar11) {
              ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
              pQVar14 = &QMakeEvaluator::valuesRef
                                   (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                         super_QList<ProString>;
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_778,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              local_608._0_8_ = &local_128;
              ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
              local_558._0_8_ = local_608._0_8_;
              ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
              local_528.m_string.d.ptr = L".";
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
              QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,
                        (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)
                        local_558,&local_68);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                         *)local_3c8,
                        (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,(char (*) [2])0x2b73ae);
              pQVar24 = *ppQVar1;
              pcVar23 = "QMAKE_EXTENSION_PLUGIN";
            }
            else {
              ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
              pQVar14 = &QMakeEvaluator::valuesRef
                                   (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                         super_QList<ProString>;
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_778,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              local_608._0_8_ = &local_128;
              ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
              local_558._0_8_ = local_608._0_8_;
              ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
              local_528.m_string.d.ptr = L".";
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_PLUGIN");
              QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,
                        (QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)
                        local_558,&local_68);
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                         *)local_3c8,
                        (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_4a8,(char (*) [2])0x2b73ae);
              pQVar24 = *ppQVar1;
              pcVar23 = "VER_MAJ";
            }
            ProKey::ProKey((ProKey *)&local_f8,pcVar23);
            QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                              *)local_3c8,&local_c8);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                      ((ProString *)&local_6f8,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)local_2d8);
            QList<ProString>::append(pQVar14,(rvalue_ref)&local_6f8);
            if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                   *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_2d8);
            if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_3c8);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)local_4a8);
            if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
              }
            }
            if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_608._8_8_)->d).d =
                   *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                   *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
              }
            }
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_2d8,"TARGET_x.y.z");
            pQVar19 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_3c8,"TARGET");
            pQVar20 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
            QArrayDataPointer<ProString>::operator=(pQVar20,pQVar19);
            if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                   *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
              LOCK();
              ((__atomic_base<int> *)
              &(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d)->_M_i =
                   ((__atomic_base<int> *)
                   &(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)
                      &(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d)->_M_i;
              UNLOCK();
              pPVar17 = (ProString *)local_128.m_string.d.d;
              goto joined_r0x001d2e63;
            }
          }
          else {
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_2d8,"QMAKE_HPUX_SHLIB");
            bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            pQVar24 = *ppQVar1;
            if (bVar11) {
              ProKey::ProKey((ProKey *)local_2d8,"QMAKE_AIX_SHLIB");
              bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              if (!bVar11) {
                ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
                pQVar18 = (QMovableArrayOps<ProString> *)
                          QMakeEvaluator::valuesRef
                                    (&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_608,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)local_558,&pQVar24->super_QMakeEvaluator,(ProKey *)local_608
                          );
                local_2d8._0_8_ = "lib";
                ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
                ProString::ProString<char_const(&)[4],ProString>
                          ((ProString *)local_4a8,
                           (QStringBuilder<const_char_(&)[4],_ProString> *)local_2d8);
                QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                          (pQVar18,0,(ProString *)local_4a8);
                if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                       *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                  }
                }
                if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_558._0_8_)->d).d =
                       *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_608._0_8_)->d).d =
                       *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                       *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_558,"TARGET_");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"QMAKE_PREFIX_STATICLIB");
                QMakeEvaluator::first
                          ((ProString *)&local_688,&pQVar24->super_QMakeEvaluator,
                           (ProKey *)&local_6f8);
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_778,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,
                           (ProKey *)local_778);
                ProString::ProString((ProString *)local_4a8,(ProString *)&local_688);
                ProString::ProString((ProString *)(local_4a8 + 0x30),(ProString *)&local_738);
                ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
                ProString::ProString((ProString *)local_398,(ProString *)(local_4a8 + 0x30));
                local_368 = (Data *)0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_STATICLIB");
                QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_68);
                ProString::
                ProString<QStringBuilder<QStringBuilder<ProString,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)local_608,
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar14,(ProString *)local_608);
                if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_608._0_8_)->d).d =
                       *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)local_3c8);
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)local_4a8);
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                       *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                  }
                }
                if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                       *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                  }
                }
                if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_558._0_8_)->d).d =
                       *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                QString::QString((QString *)local_2d8,"lib_version_first");
                config_06.m_data = (storage_type_conflict *)local_2d8._8_8_;
                config_06.m_size = local_2d8._16_8_;
                bVar11 = QMakeEvaluator::isActiveConfig
                                   (&pQVar24->super_QMakeEvaluator,config_06,false);
                if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                       *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                if (bVar11) {
                  ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                  pQVar14 = &QMakeEvaluator::valuesRef
                                       (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                             super_QList<ProString>;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)local_778,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,
                             (ProKey *)local_778);
                  local_608._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                  local_558._0_8_ = local_608._0_8_;
                  ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                  local_528.m_string.d.ptr = L".";
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_68);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_2d8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_3c8,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar14,(rvalue_ref)&local_6f8);
                  if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                         *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_608._8_8_)->d).d =
                         *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                         *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                    }
                  }
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                  pQVar14 = &QMakeEvaluator::valuesRef
                                       (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738)->
                             super_QList<ProString>;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                  pPVar17 = &local_6f8.a.a.b;
                  local_6f8.a.a.a = (char (*) [4])0x2b4610;
                  ProString::ProString(pPVar17,&local_68);
                  local_688.a.a.a.a = local_6f8.a.a.a;
                  ProString::ProString(&local_688.a.a.a.b,pPVar17);
                  local_688.a.a.b = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)&local_688,&local_c8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MIN");
                  QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_558,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_3c8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8);
                  local_320 = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_2d8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)local_778,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar14,(ProString *)local_778);
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData !=
                      (QArrayData *)0x0) {
                    LOCK();
                    ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData !=
                      (QArrayData *)0x0) {
                    LOCK();
                    ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_558);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_608);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  local_848 = &QMakeEvaluator::valuesRef
                                         (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68)->
                               super_QList<ProString>;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                  local_778._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                  local_738.a.a = (char (*) [4])local_778._0_8_;
                  ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                  local_738.b = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MAJ");
                  QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                  operator+(&local_6f8,&local_738,&local_128);
                  operator+(&local_688,&local_6f8,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MIN");
                  QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608,&local_688,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_558,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608);
                  local_4b0 = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_7d8,"VER_PAT");
                  QMakeEvaluator::first(&local_7a8,&pQVar24->super_QMakeEvaluator,&local_7d8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_7a8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  pcVar23 = "QMAKE_EXTENSION_SHLIB";
                }
                else {
                  ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                  pQVar14 = &QMakeEvaluator::valuesRef
                                       (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                             super_QList<ProString>;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)local_778,"TARGET");
                  QMakeEvaluator::first
                            ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,
                             (ProKey *)local_778);
                  local_608._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                  local_558._0_8_ = local_608._0_8_;
                  ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                  local_528.m_string.d.ptr = L".";
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_68);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_2d8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_3c8,&local_c8);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)&local_6f8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar14,(rvalue_ref)&local_6f8);
                  if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                         *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_608._8_8_)->d).d =
                         *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                         *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                    }
                  }
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                  pQVar14 = &QMakeEvaluator::valuesRef
                                       (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738)->
                             super_QList<ProString>;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_98,"TARGET");
                  QMakeEvaluator::first
                            (&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                  pPVar17 = &local_6f8.a.a.b;
                  local_6f8.a.a.a = (char (*) [4])0x2b4610;
                  ProString::ProString(pPVar17,&local_68);
                  local_688.a.a.a.a = local_6f8.a.a.a;
                  ProString::ProString(&local_688.a.a.a.b,pPVar17);
                  local_688.a.a.b = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,
                            (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)&local_688,&local_c8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_608,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_158,"VER_MAJ");
                  QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                    *)local_558,&local_128);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_3c8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_4a8);
                  local_320 = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MIN");
                  QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_2d8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,&local_188);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)local_778,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                              *)local_2d8);
                  QList<ProString>::append(pQVar14,(ProString *)local_778);
                  if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_2d8);
                  if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData !=
                      (QArrayData *)0x0) {
                    LOCK();
                    ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_3c8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_4a8);
                  if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData !=
                      (QArrayData *)0x0) {
                    LOCK();
                    ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_558);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)local_608);
                  if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                    }
                  }
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                  local_848 = &QMakeEvaluator::valuesRef
                                         (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68)->
                               super_QList<ProString>;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                  QMakeEvaluator::first
                            (&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                  local_778._0_8_ = "lib";
                  ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                  local_738.a.a = (char (*) [4])local_778._0_8_;
                  ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                  local_738.b = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_158,"QMAKE_EXTENSION_SHLIB");
                  QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                  operator+(&local_6f8,&local_738,&local_128);
                  operator+(&local_688,&local_6f8,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_1b8,"VER_MAJ");
                  QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608,&local_688,&local_188);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_558,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                    *)local_608);
                  local_4b0 = (char (*) [2])0x2b73ae;
                  pQVar24 = *ppQVar1;
                  ProKey::ProKey(&local_7d8,"VER_MIN");
                  QMakeEvaluator::first(&local_7a8,&pQVar24->super_QMakeEvaluator,&local_7d8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_558,&local_7a8);
                  operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)local_3c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_4a8,(char (*) [2])0x2b73ae);
                  pQVar24 = *ppQVar1;
                  pcVar23 = "VER_PAT";
                }
                ProKey::ProKey(&local_838,pcVar23);
                QMakeEvaluator::first(&local_808,&pQVar24->super_QMakeEvaluator,&local_838);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_808);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          (&local_98,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(local_848,&local_98);
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_808.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_808.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_838.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_838.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if (&(local_7a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_7a8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_558);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_608);
                if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_688.a);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder(&local_6f8);
                if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1
                  ;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0)
                  {
                    QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((ProString *)local_738.a.b.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d
                       + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d
                      == 0) {
                    QArrayData::deallocate(&(local_738.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((ProString *)local_778._8_8_ != (ProString *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i =
                       ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._8_8_,2,0x10);
                  }
                }
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                pcVar23 = "TARGET_x.y.z";
                goto LAB_001d5e78;
              }
              ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
              pQVar18 = (QMovableArrayOps<ProString> *)
                        QMakeEvaluator::valuesRef
                                  (&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_608,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_558,&pQVar24->super_QMakeEvaluator,(ProKey *)local_608);
              local_2d8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
              ProString::ProString<char_const(&)[4],ProString>
                        ((ProString *)local_4a8,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)local_2d8);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        (pQVar18,0,(ProString *)local_4a8);
              if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                     *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_558._0_8_)->d).d =
                     *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                     *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_558,"TARGET_");
              pQVar14 = &QMakeEvaluator::valuesRef
                                   (&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)->
                         super_QList<ProString>;
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)&local_688,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_6f8
                        );
              local_4a8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
              local_3c8._0_8_ = local_4a8._0_8_;
              ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
              local_398._8_8_ = ".";
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_778,"QMAKE_EXTENSION_SHLIB");
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_2d8,
                        (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                         *)local_3c8,(ProString *)&local_738);
              ProString::
              ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                        ((ProString *)local_608,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QList<ProString>::append(pQVar14,(ProString *)local_608);
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                     *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                }
              }
              if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                     *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                }
              }
              if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_558._0_8_)->d).d =
                     *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              QString::QString((QString *)local_2d8,"lib_version_first");
              config_04.m_data = (storage_type_conflict *)local_2d8._8_8_;
              config_04.m_size = local_2d8._16_8_;
              bVar11 = QMakeEvaluator::isActiveConfig
                                 (&pQVar24->super_QMakeEvaluator,config_04,false);
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              if (bVar11) {
                ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_778,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,
                           (ProKey *)local_778);
                local_608._0_8_ = "lib";
                ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                local_558._0_8_ = local_608._0_8_;
                ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                local_528.m_string.d.ptr = L".";
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
                QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_68);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_c8);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)&local_6f8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar14,(rvalue_ref)&local_6f8);
                if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                       *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                  }
                }
                if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_608._8_8_)->d).d =
                       *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                       *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"TARGET");
                QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                pPVar17 = &local_6f8.a.a.b;
                local_6f8.a.a.a = (char (*) [4])0x2b4610;
                ProString::ProString(pPVar17,&local_68);
                local_688.a.a.a.a = local_6f8.a.a.a;
                ProString::ProString(&local_688.a.a.a.b,pPVar17);
                local_688.a.a.b = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)&local_688,&local_c8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_158,"VER_MIN");
                QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_558,&local_128);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_3c8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8);
                local_320 = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_1b8,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,&local_188);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)local_778,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar14,(ProString *)local_778);
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1
                  ;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0)
                  {
                    QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_558);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_608);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10)
                    ;
                  }
                }
                if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                local_848 = &QMakeEvaluator::valuesRef
                                       (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68)->
                             super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                local_778._0_8_ = "lib";
                ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                local_738.a.a = (char (*) [4])local_778._0_8_;
                ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                local_738.b = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_158,"VER_MAJ");
                QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                operator+(&local_6f8,&local_738,&local_128);
                operator+(&local_688,&local_6f8,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_1b8,"VER_MIN");
                QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608,&local_688,&local_188);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_558,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608);
                local_4b0 = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_7d8,"VER_PAT");
                QMakeEvaluator::first(&local_7a8,&pQVar24->super_QMakeEvaluator,&local_7d8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_7a8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                pcVar23 = "QMAKE_EXTENSION_SHLIB";
              }
              else {
                ProKey::ProKey((ProKey *)&local_688,"TARGET_x");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_778,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,
                           (ProKey *)local_778);
                local_608._0_8_ = "lib";
                ProString::ProString((ProString *)(local_608 + 8),(ProString *)&local_738);
                local_558._0_8_ = local_608._0_8_;
                ProString::ProString((ProString *)(local_558 + 8),(ProString *)(local_608 + 8));
                local_528.m_string.d.ptr = L".";
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_68);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_f8,"VER_MAJ");
                QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_2d8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_3c8,&local_c8);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)&local_6f8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar14,(rvalue_ref)&local_6f8);
                if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                       *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_558._8_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_558._8_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_558._8_8_,2,0x10);
                  }
                }
                if ((ProString *)local_608._8_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_608._8_8_)->d).d =
                       *(int *)&(((QString *)local_608._8_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_608._8_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_608._8_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                       *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_738,"TARGET_x.y");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_98,"TARGET");
                QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
                pPVar17 = &local_6f8.a.a.b;
                local_6f8.a.a.a = (char (*) [4])0x2b4610;
                ProString::ProString(pPVar17,&local_68);
                local_688.a.a.a.a = local_6f8.a.a.a;
                ProString::ProString(&local_688.a.a.a.b,pPVar17);
                local_688.a.a.b = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_f8,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,
                          (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                           *)&local_688,&local_c8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,
                          (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_608,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_158,"VER_MAJ");
                QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                  *)local_558,&local_128);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_3c8,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_4a8);
                local_320 = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_1b8,"VER_MIN");
                QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,&local_188);
                ProString::
                ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)local_778,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8);
                QList<ProString>::append(pQVar14,(ProString *)local_778);
                if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_2d8);
                if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_3c8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_4a8);
                if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1
                  ;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0)
                  {
                    QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   ) {
                  LOCK();
                  ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_558);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)local_608);
                if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_688.a.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_688.a.a.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_6f8.a.a.b.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_6f8.a.a.b.m_string.d.d)->super_QArrayData,2,0x10)
                    ;
                  }
                }
                if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                  }
                }
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_68,"TARGET_x.y.z");
                local_848 = &QMakeEvaluator::valuesRef
                                       (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68)->
                             super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_f8,"TARGET");
                QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
                local_778._0_8_ = "lib";
                ProString::ProString((ProString *)(local_778 + 8),&local_c8);
                local_738.a.a = (char (*) [4])local_778._0_8_;
                ProString::ProString(&local_738.a.b,(ProString *)(local_778 + 8));
                local_738.b = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_158,"QMAKE_EXTENSION_SHLIB");
                QMakeEvaluator::first(&local_128,&pQVar24->super_QMakeEvaluator,&local_158);
                operator+(&local_6f8,&local_738,&local_128);
                operator+(&local_688,&local_6f8,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_1b8,"VER_MAJ");
                QMakeEvaluator::first(&local_188,&pQVar24->super_QMakeEvaluator,&local_1b8);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608,&local_688,&local_188);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_558,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                  *)local_608);
                local_4b0 = (char (*) [2])0x2b73ae;
                pQVar24 = *ppQVar1;
                ProKey::ProKey(&local_7d8,"VER_MIN");
                QMakeEvaluator::first(&local_7a8,&pQVar24->super_QMakeEvaluator,&local_7d8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_558,&local_7a8);
                operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)local_3c8,
                          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8,(char (*) [2])0x2b73ae);
                pQVar24 = *ppQVar1;
                pcVar23 = "VER_PAT";
              }
              ProKey::ProKey(&local_838,pcVar23);
              QMakeEvaluator::first(&local_808,&pQVar24->super_QMakeEvaluator,&local_838);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                *)local_2d8,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                *)local_3c8,&local_808);
              ProString::
              ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                        (&local_98,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QList<ProString>::append(local_848,&local_98);
              if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if (&(local_808.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_808.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_808.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_838.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_838.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_838.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_3c8);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_4a8);
              if (&(local_7a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_7a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_7a8.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_7d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_7d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_558);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_608);
              if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder(&local_688.a);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder(&local_6f8);
              if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((ProString *)local_738.a.b.m_string.d.d != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d +
                     -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_738.a.b.m_string.d.d)->super_QArrayData)->d).d ==
                    0) {
                  QArrayData::deallocate(&(local_738.a.b.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((ProString *)local_778._8_8_ != (ProString *)0x0) {
                LOCK();
                ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i =
                     ((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i + -1;
                UNLOCK();
                if (((__atomic_base<int> *)&(((QString *)local_778._8_8_)->d).d)->_M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_778._8_8_,2,0x10);
                }
              }
              if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              QString::QString((QString *)local_2d8,"unversioned_libname");
              config_07.m_data = (storage_type_conflict *)local_2d8._8_8_;
              config_07.m_size = local_2d8._16_8_;
              bVar11 = QMakeEvaluator::isActiveConfig
                                 (&pQVar24->super_QMakeEvaluator,config_07,false);
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              if (bVar11) {
                pcVar23 = "TARGET_";
              }
              else {
                pcVar23 = "TARGET_x.y.z";
              }
              ProKey::ProKey((ProKey *)local_2d8,pcVar23);
            }
            else {
              ProKey::ProKey((ProKey *)local_3c8,"PRL_TARGET");
              pQVar18 = (QMovableArrayOps<ProString> *)
                        QMakeEvaluator::valuesRef
                                  (&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_608,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_558,&pQVar24->super_QMakeEvaluator,(ProKey *)local_608);
              local_2d8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)local_558);
              ProString::ProString<char_const(&)[4],ProString>
                        ((ProString *)local_4a8,
                         (QStringBuilder<const_char_(&)[4],_ProString> *)local_2d8);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                        (pQVar18,0,(ProString *)local_4a8);
              if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                     *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_558._0_8_)->d).d =
                     *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                     *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_4a8,"TARGET_");
              pQVar14 = &QMakeEvaluator::valuesRef
                                   (&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8)->
                         super_QList<ProString>;
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_688,"TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)
              ;
              local_3c8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)local_608);
              local_2d8._0_8_ = local_3c8._0_8_;
              ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)(local_3c8 + 8));
              local_2a8._8_8_ = ".sl";
              ProString::ProString<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[4]>
                        ((ProString *)local_558,
                         (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[4]>
                          *)local_2d8);
              QList<ProString>::append(pQVar14,(ProString *)local_558);
              if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_558._0_8_)->d).d =
                     *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                     *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                }
              }
              if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                     *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              QString::QString((QString *)local_2d8,"lib_version_first");
              config_05.m_data = (storage_type_conflict *)local_2d8._8_8_;
              config_05.m_size = local_2d8._16_8_;
              bVar11 = QMakeEvaluator::isActiveConfig
                                 (&pQVar24->super_QMakeEvaluator,config_05,false);
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              if (bVar11) {
                ProKey::ProKey((ProKey *)local_558,"TARGET_x");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"VER_MAJ");
                QMakeEvaluator::first
                          ((ProString *)&local_688,&pQVar24->super_QMakeEvaluator,
                           (ProKey *)&local_6f8);
                local_4a8._0_8_ = "lib";
                ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
                local_3c8._0_8_ = local_4a8._0_8_;
                ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
                pQVar24 = *ppQVar1;
                pcVar23 = "TARGET";
              }
              else {
                ProKey::ProKey((ProKey *)local_558,"TARGET_x");
                pQVar14 = &QMakeEvaluator::valuesRef
                                     (&pQVar24->super_QMakeEvaluator,(ProKey *)local_558)->
                           super_QList<ProString>;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
                QMakeEvaluator::first
                          ((ProString *)&local_688,&pQVar24->super_QMakeEvaluator,
                           (ProKey *)&local_6f8);
                local_4a8._0_8_ = "lib";
                ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)&local_688);
                local_3c8._0_8_ = local_4a8._0_8_;
                ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
                pQVar24 = *ppQVar1;
                pcVar23 = "VER_MAJ";
              }
              local_398._8_8_ = ".";
              ProKey::ProKey((ProKey *)local_778,pcVar23);
              QMakeEvaluator::first
                        ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,(ProKey *)local_778)
              ;
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_2d8,
                        (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                         *)local_3c8,(ProString *)&local_738);
              ProString::
              ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                        ((ProString *)local_608,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QList<ProString>::append(pQVar14,(ProString *)local_608);
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                     *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
                }
              }
              if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                     *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                }
              }
              if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_558._0_8_)->d).d =
                     *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
                }
              }
              pQVar24 = *ppQVar1;
              pcVar23 = "TARGET_x";
LAB_001d5e78:
              ProKey::ProKey((ProKey *)local_2d8,pcVar23);
            }
            pQVar19 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_3c8,"TARGET");
            pQVar20 = (QArrayDataPointer<ProString> *)
                      QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
            QArrayDataPointer<ProString>::operator=(pQVar20,pQVar19);
            if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                   *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i =
                   ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i;
              UNLOCK();
              pPVar17 = (ProString *)local_2d8._0_8_;
              goto joined_r0x001d2e63;
            }
          }
        }
        else {
          ProKey::ProKey((ProKey *)local_608,"PRL_TARGET");
          pQVar18 = (QMovableArrayOps<ProString> *)
                    QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_608);
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_738,"QMAKE_BUNDLE");
          QMakeEvaluator::first
                    ((ProString *)&local_6f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738);
          ProString::ProString((ProString *)local_558,(ProString *)&local_6f8);
          local_528.m_string.d.d = (Data *)0x2ae5dc;
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"QMAKE_FRAMEWORK_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_778,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68);
          ProString::ProString((ProString *)local_4a8,(ProString *)local_558);
          local_4a8._48_8_ = local_528.m_string.d.d;
          ProString::ProString((ProString *)(local_4a8 + 0x38),(ProString *)local_778);
          ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
          local_398._0_8_ = local_4a8._48_8_;
          ProString::ProString((ProString *)(local_398 + 8),(ProString *)(local_4a8 + 0x38));
          local_360 = (ProString *)0x2af372;
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_c8,"TARGET");
          QMakeEvaluator::first(&local_98,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_c8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                            *)local_2d8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>
                            *)local_3c8,&local_98);
          ProString::
          ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,char_const(&)[12]>,ProString>
                    ((ProString *)&local_688,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                      *)local_2d8);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    (pQVar18,0,(ProString *)&local_688);
          if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                             *)local_2d8);
          if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     local_3c8);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     local_4a8);
          if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
            }
          }
          if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_558._0_8_)->d).d =
                 *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
            }
          }
          if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
            }
          }
          if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_608._0_8_)->d).d =
                 *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          local_608._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_5e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_608._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_608._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_608._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_608._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE_LOCATION");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
          if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                 *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
          if ((local_608._28_4_ != 0) &&
             (bVar11 = ProString::startsWith((ProString *)local_608,"/",CaseSensitive), !bVar11)) {
            ProString::ProString((ProString *)local_2d8,"/");
            ProString::prepend((ProString *)local_608,(ProString *)local_2d8);
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
          }
          bVar11 = ProString::endsWith((ProString *)local_608,"/",CaseSensitive);
          if (!bVar11) {
            other_00.m_data = "/";
            other_00.m_size = 1;
            ProString::append((ProString *)local_608,other_00);
          }
          local_128.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_128.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_128.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_558,"QMAKE_BUNDLE");
          QMakeEvaluator::first
                    ((ProString *)local_4a8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_558);
          ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
          pQVar24 = *ppQVar1;
          local_398._0_8_ = (ProString *)local_608;
          ProKey::ProKey((ProKey *)&local_6f8,"TARGET");
          QMakeEvaluator::first
                    ((ProString *)&local_688,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_6f8);
          ProString::ProString((ProString *)local_2d8,(ProString *)local_3c8);
          local_2a8._0_8_ = local_398._0_8_;
          ProString::ProString((ProString *)(local_2a8 + 8),(ProString *)&local_688);
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::convertTo<QString>
                    (&local_128.m_string,
                     (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)local_2d8)
          ;
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)local_2d8)
          ;
          if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
            }
          }
          if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
            }
          }
          if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                 *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                 *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_558._0_8_)->d).d =
                 *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_2d8,"TARGET_");
          pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
                     super_QList<ProString>;
          ProString::ProString((ProString *)local_3c8,&local_128.m_string);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_3c8
                    );
          QList<ProString>::end(pQVar14);
          if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                 *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                 *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
          pQVar24 = *ppQVar1;
          QVar31.m_data = (storage_type *)0xe;
          QVar31.m_size = (qsizetype)local_2d8;
          QString::fromUtf8(QVar31);
          uVar4 = local_2d8._0_8_;
          config_03.m_data = (storage_type_conflict *)local_2d8._8_8_;
          config_03.m_size = local_2d8._16_8_;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_03,false);
          if ((ProString *)uVar4 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar4)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
            }
          }
          pQVar24 = *ppQVar1;
          if (bVar11) {
            ProKey::ProKey((ProKey *)local_2d8,"TARGET_x.y");
            pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)
                       ->super_QList<ProString>;
            ProString::ProString((ProString *)local_3c8,&local_128.m_string);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,
                       (ProString *)local_3c8);
            QList<ProString>::end(pQVar14);
            if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                   *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i =
                   ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i;
              UNLOCK();
              pPVar17 = (ProString *)local_2d8._0_8_;
joined_r0x001d2e0d:
              if (iVar2 == 0) {
                QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
              }
            }
          }
          else {
            ProKey::ProKey((ProKey *)&local_688,"TARGET_x.y");
            pQVar14 = &QMakeEvaluator::valuesRef
                                 (&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)->
                       super_QList<ProString>;
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_778,"QMAKE_BUNDLE");
            QMakeEvaluator::first
                      ((ProString *)&local_738,&pQVar24->super_QMakeEvaluator,(ProKey *)local_778);
            ProString::ProString((ProString *)local_558,(ProString *)&local_738);
            local_528.m_string.d.d = (Data *)0x2ae5dc;
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_98,"QMAKE_FRAMEWORK_VERSION");
            QMakeEvaluator::first(&local_68,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98);
            ProString::ProString((ProString *)local_4a8,(ProString *)local_558);
            local_4a8._48_8_ = local_528.m_string.d.d;
            ProString::ProString((ProString *)(local_4a8 + 0x38),&local_68);
            ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
            local_398._0_8_ = local_4a8._48_8_;
            ProString::ProString((ProString *)(local_398 + 8),(ProString *)(local_4a8 + 0x38));
            local_360 = (ProString *)local_608;
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)&local_f8,"TARGET");
            QMakeEvaluator::first(&local_c8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_f8);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                              *)local_2d8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>
                              *)local_3c8,&local_c8);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,ProString&>,ProString>
                      ((ProString *)&local_6f8,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                        *)local_2d8);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,
                       (ProString *)&local_6f8);
            QList<ProString>::end(pQVar14);
            if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                   *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                               *)local_2d8);
            if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)local_3c8);
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)local_4a8);
            if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_558._0_8_)->d).d =
                   *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
              }
            }
            if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
              }
            }
            if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i =
                   ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i + -1;
              iVar2 = ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i;
              UNLOCK();
              pPVar17 = (ProString *)local_688.a.a.a.a;
              goto joined_r0x001d2e0d;
            }
          }
          if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_608._0_8_ == (ProString *)0x0) goto LAB_001d5f34;
          LOCK();
          ((__atomic_base<int> *)&(((QString *)local_608._0_8_)->d).d)->_M_i =
               ((__atomic_base<int> *)&(((QString *)local_608._0_8_)->d).d)->_M_i + -1;
          iVar2 = ((__atomic_base<int> *)&(((QString *)local_608._0_8_)->d).d)->_M_i;
          UNLOCK();
          pPVar17 = (ProString *)local_608._0_8_;
joined_r0x001d2e63:
          if (iVar2 == 0) {
            QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
          }
        }
LAB_001d5f34:
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_SONAME");
        pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
        lVar3 = (pPVar15->super_QList<ProString>).d.size;
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (lVar3 != 0) {
          local_558._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_530 = &DAT_aaaaaaaaaaaaaaaa;
          local_558._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_558._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_558._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_558._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ProString::ProString((ProString *)local_558);
          pQVar24 = *ppQVar1;
          QVar32.m_data = (storage_type *)0x6;
          QVar32.m_size = (qsizetype)local_2d8;
          QString::fromUtf8(QVar32);
          uVar4 = local_2d8._0_8_;
          config_08.m_data = (storage_type_conflict *)local_2d8._8_8_;
          config_08.m_size = local_2d8._16_8_;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_08,false);
          if ((ProString *)uVar4 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar4)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
            }
          }
          pQVar24 = *ppQVar1;
          if (bVar11) {
            ProKey::ProKey((ProKey *)local_2d8,"TARGET");
            pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
            lVar3 = (pPVar15->super_QList<ProString>).d.size;
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (lVar3 == 0) goto LAB_001d63d8;
            pQVar24 = *ppQVar1;
            pcVar23 = "TARGET";
LAB_001d6352:
            ProKey::ProKey((ProKey *)local_3c8,pcVar23);
            QMakeEvaluator::first
                      ((ProString *)local_2d8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
            ProString::append((ProString *)local_558,(ProString *)local_2d8,(bool *)0x0);
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i =
                   ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i + -1;
              UNLOCK();
              pPVar17 = (ProString *)local_3c8._0_8_;
              if (((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i == 0) {
LAB_001d63c9:
                QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
              }
            }
          }
          else {
            ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE");
            bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (!bVar11) {
              pQVar24 = *ppQVar1;
              pcVar23 = "TARGET_x.y";
              goto LAB_001d6352;
            }
            pQVar24 = *ppQVar1;
            QString::QString((QString *)local_2d8,"unversioned_soname");
            config_09.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_09.m_size = local_2d8._16_8_;
            bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_09,false);
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (bVar11) {
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_688,"QMAKE_ORIG_TARGET");
              QMakeEvaluator::first
                        ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688)
              ;
              local_4a8._0_8_ = "lib";
              ProString::ProString((ProString *)(local_4a8 + 8),(ProString *)local_608);
              local_3c8._0_8_ = local_4a8._0_8_;
              ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)(local_4a8 + 8));
              local_398._8_8_ = ".";
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)&local_738,"QMAKE_EXTENSION_SHLIB");
              QMakeEvaluator::first
                        ((ProString *)&local_6f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738
                        );
              operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                         *)local_2d8,
                        (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                         *)local_3c8,(ProString *)&local_6f8);
              ProString::operator=
                        ((ProString *)local_558,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)local_2d8);
              if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                     *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
                }
              }
              if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
                }
              }
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_688.a.a.a.a == (ProString *)0x0) goto LAB_001d63d8;
              LOCK();
              ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i =
                   ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i + -1;
              UNLOCK();
              pPVar17 = (ProString *)local_688.a.a.a.a;
              if (((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i != 0)
              goto LAB_001d63d8;
              goto LAB_001d63c9;
            }
            pQVar24 = *ppQVar1;
            ProKey::ProKey((ProKey *)local_2d8,"TARGET_x");
            pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
            lVar3 = (pPVar15->super_QList<ProString>).d.size;
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
            if (lVar3 != 0) {
              pQVar24 = *ppQVar1;
              pcVar23 = "TARGET_x";
              goto LAB_001d6352;
            }
          }
LAB_001d63d8:
          if (local_558._28_4_ != 0) {
            pQVar24 = *ppQVar1;
            QVar33.m_data = (storage_type *)0x17;
            QVar33.m_size = (qsizetype)local_2d8;
            QString::fromUtf8(QVar33);
            uVar4 = local_2d8._0_8_;
            bVar11 = false;
            config_10.m_data = (storage_type_conflict *)local_2d8._8_8_;
            config_10.m_size = local_2d8._16_8_;
            bVar13 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_10,false);
            if (bVar13) {
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_2d8,"INSTALLS");
              pQVar14 = &QMakeEvaluator::valuesRef
                                   (&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
                         super_QList<ProString>;
              bVar11 = false;
              qVar21 = QtPrivate::indexOf<ProString,char[7]>(pQVar14,(char (*) [7])0x2ac99e,0);
              if (qVar21 != -1) {
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_3c8,"target.path");
                bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_3c8);
                if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                       *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                  }
                }
                bVar11 = !bVar11;
              }
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
            }
            if ((ProString *)uVar4 != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar4)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
              }
            }
            if (bVar11) {
              local_4a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_4a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_4a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_3c8,"target.path");
              QMakeEvaluator::first
                        ((ProString *)local_2d8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
              ProString::toQString((QString *)local_608,(ProString *)local_2d8);
              Option::fixPathToTargetOS((QString *)local_4a8,(QString *)local_608,true,true);
              if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_608._0_8_)->d).d =
                     *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
                LOCK();
                ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i =
                     ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i + -1;
                iVar2 = ((__atomic_base<int> *)&(((QString *)local_3c8._0_8_)->d).d)->_M_i;
                UNLOCK();
                pPVar17 = (ProString *)local_3c8._0_8_;
joined_r0x001d6773:
                if (iVar2 == 0) {
                  QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
                }
              }
LAB_001d6782:
              cVar12 = QString::endsWith((QString *)local_4a8,0x2e5bf0);
              if (cVar12 == '\0') {
                QString::append((QString *)local_4a8);
              }
              ProString::ProString((ProString *)local_2d8,(QString *)local_4a8);
              ProString::prepend((ProString *)local_558,(ProString *)local_2d8);
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                     *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
                }
              }
            }
            else {
              pQVar24 = *ppQVar1;
              ProKey::ProKey((ProKey *)local_2d8,"QMAKE_SONAME_PREFIX");
              bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
              if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                     *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                }
              }
              if (!bVar11) {
                local_4a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_4a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_4a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                pQVar24 = *ppQVar1;
                ProKey::ProKey((ProKey *)local_3c8,"QMAKE_SONAME_PREFIX");
                QMakeEvaluator::first
                          ((ProString *)local_2d8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8
                          );
                ProString::toQString((QString *)local_4a8,(ProString *)local_2d8);
                if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                       *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                       *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
                  }
                }
                cVar12 = QString::startsWith((QChar)(char16_t)local_4a8,0x40);
                if (cVar12 == '\0') {
                  Option::fixPathToTargetOS((QString *)local_2d8,(QString *)local_4a8,false,true);
                  uVar10 = local_2d8._16_8_;
                  uVar9 = local_2d8._8_8_;
                  uVar5 = local_2d8._0_8_;
                  local_2d8._16_8_ = local_4a8._16_8_;
                  uVar4 = local_4a8._8_8_;
                  local_2d8._0_8_ = local_4a8._0_8_;
                  local_4a8._0_8_ = uVar5;
                  local_4a8._8_8_ = local_2d8._8_8_;
                  local_2d8._8_8_ = uVar4;
                  local_4a8._16_8_ = uVar10;
                  if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
                    LOCK();
                    ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i =
                         ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i + -1;
                    iVar2 = ((__atomic_base<int> *)&(((QString *)local_2d8._0_8_)->d).d)->_M_i;
                    UNLOCK();
                    local_4a8._8_8_ = uVar9;
                    pPVar17 = (ProString *)local_2d8._0_8_;
                    goto joined_r0x001d6773;
                  }
                }
                goto LAB_001d6782;
              }
            }
            MakefileGenerator::escapeFilePath
                      ((ProString *)local_2d8,&this->super_MakefileGenerator,(ProString *)local_558)
            ;
            pQVar24 = (this->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS_SONAME");
            pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8)
                       ->super_QList<ProString>;
            iVar16 = QList<ProString>::begin(pQVar14);
            ProString::append(iVar16.i,(ProString *)local_2d8,(bool *)0x0);
            if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                   *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
              }
            }
          }
          if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_558._0_8_)->d).d =
                 *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
        }
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LINK_SHLIB_CMD");
        pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
        lVar3 = (pPVar15->super_QList<ProString>).d.size;
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (lVar3 == 0) {
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_4a8,"QMAKE_LINK_SHLIB_CMD");
          pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8)->
                     super_QList<ProString>;
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_688,"QMAKE_LINK_O_FLAG");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688);
          local_3c8._0_8_ = "$(LINK) $(LFLAGS) ";
          ProString::ProString((ProString *)(local_3c8 + 8),(ProString *)local_608);
          local_2d8._0_8_ = local_3c8._0_8_;
          ProString::ProString((ProString *)(local_2d8 + 8),(ProString *)(local_3c8 + 8));
          local_2a8._8_8_ = "$(TARGET) $(OBJECTS) $(LIBS) $(OBJCOMP)";
          ProString::ProString<QStringBuilder<char_const(&)[19],ProString>,char_const(&)[40]>
                    ((ProString *)local_558,
                     (QStringBuilder<QStringBuilder<const_char_(&)[19],_ProString>,_const_char_(&)[40]>
                      *)local_2d8);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_558
                    );
          QList<ProString>::end(pQVar14);
          if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_558._0_8_)->d).d =
                 *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_2d8._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_2d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_2d8._8_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_3c8._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_3c8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_3c8._8_8_,2,0x10);
            }
          }
          if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_608._0_8_)->d).d =
                 *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
            }
          }
          if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)local_4a8._0_8_)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)local_4a8._0_8_)->d).d)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)&(((QString *)local_4a8._0_8_)->d).d)->_M_i;
            UNLOCK();
            pPVar17 = (ProString *)local_4a8._0_8_;
            goto joined_r0x001d775d;
          }
        }
      }
    }
    else {
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE");
      bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar11) {
        local_3c8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_3a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_3c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"QMAKE_BUNDLE_LOCATION");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if ((local_3c8._28_4_ != 0) &&
           (bVar11 = ProString::startsWith((ProString *)local_3c8,"/",CaseSensitive), !bVar11)) {
          ProString::ProString((ProString *)local_2d8,"/");
          ProString::prepend((ProString *)local_3c8,(ProString *)local_2d8);
          if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_2d8._0_8_)->d).d =
                 *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
            }
          }
        }
        bVar11 = ProString::endsWith((ProString *)local_3c8,"/",CaseSensitive);
        if (!bVar11) {
          other.m_data = "/";
          other.m_size = 1;
          ProString::append((ProString *)local_3c8,other);
        }
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"TARGET");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8)->
                   super_QList<ProString>;
        iVar16 = QList<ProString>::begin(pQVar14);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_688,"QMAKE_BUNDLE");
        QMakeEvaluator::first
                  ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688);
        ProString::ProString((ProString *)local_2d8,(ProString *)local_608);
        local_2a8._0_8_ = (ProString *)local_3c8;
        ProString::ProString<ProString,ProString&>
                  ((ProString *)local_558,(QStringBuilder<ProString,_ProString_&> *)local_2d8);
        ProString::prepend(iVar16.i,(ProString *)local_558);
        if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_558._0_8_)->d).d =
               *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_608._0_8_)->d).d =
               *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
               *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
          }
        }
        if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_4a8._0_8_)->d).d =
               *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_3c8._0_8_)->d).d =
               *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"TARGET");
      bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar11) {
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"TARGET");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8)->
                   super_QList<ProString>;
        iVar16 = QList<ProString>::begin(pQVar14);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_4a8,"DESTDIR");
        QMakeEvaluator::first
                  ((ProString *)local_3c8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8);
        ProString::prepend(iVar16.i,(ProString *)local_3c8);
        if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_3c8._0_8_)->d).d =
               *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_4a8._0_8_)->d).d =
               *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
          }
        }
joined_r0x001d0a36:
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          ((__atomic_base<int> *)&(((ProString *)local_2d8._0_8_)->m_string).d.d)->_M_i =
               ((__atomic_base<int> *)&(((ProString *)local_2d8._0_8_)->m_string).d.d)->_M_i + -1;
          iVar2 = ((__atomic_base<int> *)&(((ProString *)local_2d8._0_8_)->m_string).d.d)->_M_i;
          UNLOCK();
          pPVar17 = (ProString *)local_2d8._0_8_;
          goto joined_r0x001d775d;
        }
      }
    }
  }
LAB_001d694f:
  pQVar24 = *ppQVar1;
  ProKey::ProKey((ProKey *)local_2d8,"QMAKE_APP_FLAG");
  pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
  bVar11 = true;
  if ((pPVar15->super_QList<ProString>).d.size == 0) {
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_4a8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_3c8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_4a8)
    ;
    bVar11 = ProString::operator==((ProString *)local_3c8,"aux");
    if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_3c8._0_8_)->d).d =
           *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_4a8._0_8_)->d).d =
           *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
      }
    }
  }
  if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_2d8._0_8_)->d).d = *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
  pQVar24 = *ppQVar1;
  if (bVar11 == false) {
    QVar34.m_data = (storage_type *)0x3;
    QVar34.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar34);
    uVar4 = local_2d8._0_8_;
    config_11.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_11.m_size = local_2d8._16_8_;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_11,false);
    if ((ProString *)uVar4 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)uVar4)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (!bVar11) goto LAB_001d7e84;
    pQVar24 = *ppQVar1;
    QVar35.m_data = (storage_type *)0x6;
    QVar35.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar35);
    uVar4 = local_2d8._0_8_;
    config_12.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_12.m_size = local_2d8._16_8_;
    bVar13 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_12,false);
    bVar11 = true;
    if (bVar13) {
      pQVar24 = *ppQVar1;
      QVar36.m_data = (storage_type *)0x1c;
      QVar36.m_size = (qsizetype)local_2d8;
      QString::fromUtf8(QVar36);
      uVar5 = local_2d8._0_8_;
      config_13.m_data = (storage_type_conflict *)local_2d8._8_8_;
      config_13.m_size = local_2d8._16_8_;
      bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_13,false);
      bVar11 = !bVar11;
      if ((ProString *)uVar5 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)uVar5)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
        }
      }
    }
    if ((ProString *)uVar4 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)uVar4)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (bVar11) {
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CFLAGS_SHLIB");
      pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
      pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
                 pPVar17 + (pPVar15->super_QList<ProString>).d.size);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CXXFLAGS_SHLIB");
      pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
      pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
                 pPVar17 + (pPVar15->super_QList<ProString>).d.size);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
    }
    pQVar24 = *ppQVar1;
    QVar37.m_data = (storage_type *)0x6;
    QVar37.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar37);
    uVar4 = local_2d8._0_8_;
    config_14.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_14.m_size = local_2d8._16_8_;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_14,false);
    if ((ProString *)uVar4 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)uVar4)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    pQVar24 = *ppQVar1;
    if (bVar11) {
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CFLAGS_PLUGIN");
      pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
      pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
                 pPVar17 + (pPVar15->super_QList<ProString>).d.size);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CXXFLAGS_PLUGIN");
      pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
      pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
                 pPVar17 + (pPVar15->super_QList<ProString>).d.size);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_PLUGIN");
      pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS");
      pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
                 pPVar17 + (pPVar15->super_QList<ProString>).d.size);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar24 = *ppQVar1;
      QVar38.m_data = (storage_type *)0x12;
      QVar38.m_size = (qsizetype)local_2d8;
      QString::fromUtf8(QVar38);
      uVar4 = local_2d8._0_8_;
      config_15.m_data = (storage_type_conflict *)local_2d8._8_8_;
      config_15.m_size = local_2d8._16_8_;
      bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_15,false);
      if ((ProString *)uVar4 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)uVar4)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
        }
      }
      if (!bVar11) goto LAB_001d7e84;
    }
    else {
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_SHLIB");
      pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS");
      pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
      QtPrivate::QCommonArrayOps<ProString>::growAppend
                ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
                 pPVar17 + (pPVar15->super_QList<ProString>).d.size);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_COMPAT_VERSION");
      bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar11) {
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)local_2d8,"COMPAT_VERSION");
        bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
        if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_2d8._0_8_)->d).d =
               *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
          }
        }
        if (bVar11) {
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_688,"QMAKE_LFLAGS_COMPAT_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688);
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_738,"VER_MAJ");
          QMakeEvaluator::first
                    ((ProString *)&local_6f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738);
          ProString::ProString((ProString *)local_4a8,(ProString *)local_608);
          ProString::ProString((ProString *)(local_4a8 + 0x30),(ProString *)&local_6f8);
          ProString::ProString((ProString *)local_3c8,(ProString *)local_4a8);
          ProString::ProString((ProString *)local_398,(ProString *)(local_4a8 + 0x30));
          local_368 = (Data *)0x2b73ae;
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_68,"VER_MIN");
          QMakeEvaluator::first
                    ((ProString *)local_778,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)local_2d8,
                           (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                            *)local_3c8,(ProString *)local_778);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::convertTo<QString>
                    (&local_c8.m_string,
                     (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                      *)local_2d8);
          ProString::ProString((ProString *)local_558,&local_c8.m_string);
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_98,"QMAKE_LFLAGS");
          pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_98)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_558
                    );
          QList<ProString>::end(pQVar14);
          if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_558._0_8_)->d).d =
                 *(int *)&(((QString *)local_558._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_558._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_558._0_8_,2,0x10);
            }
          }
          if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)local_2d8);
          if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
            }
          }
          if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)local_3c8);
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)local_4a8);
          if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
            }
          }
          if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
            }
          }
          if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_608._0_8_)->d).d =
                 *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)&(((QString *)*local_688.a.a.a.a)->d).d)->_M_i;
            UNLOCK();
            pPVar17 = (ProString *)local_688.a.a.a.a;
joined_r0x001d796f:
            if (iVar2 == 0) {
              QArrayData::deallocate((QArrayData *)pPVar17,2,0x10);
            }
          }
        }
        else {
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)local_558,"QMAKE_LFLAGS_COMPAT_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_4a8,&pQVar24->super_QMakeEvaluator,(ProKey *)local_558);
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_688,"COMPATIBILITY_VERSION");
          QMakeEvaluator::first
                    ((ProString *)local_608,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_688);
          ProString::ProString((ProString *)local_2d8,(ProString *)local_4a8);
          ProString::ProString((ProString *)local_2a8,(ProString *)local_608);
          QStringBuilder<ProString,_ProString>::convertTo<QString>
                    ((QString *)&local_738,(QStringBuilder<ProString,_ProString> *)local_2d8);
          ProString::ProString((ProString *)local_3c8,(QString *)&local_738);
          pQVar24 = *ppQVar1;
          ProKey::ProKey((ProKey *)&local_6f8,"QMAKE_LFLAGS");
          pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)&local_6f8)
                     ->super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_3c8
                    );
          QList<ProString>::end(pQVar14);
          if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
            }
          }
          if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_3c8._0_8_)->d).d =
                 *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
            }
          }
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)local_2d8);
          if ((ProString *)local_608._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_608._0_8_)->d).d =
                 *(int *)&(((QString *)local_608._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_608._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
                 *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
            }
          }
          if ((ProString *)local_4a8._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_4a8._0_8_)->d).d =
                 *(int *)&(((QString *)local_4a8._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_4a8._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_4a8._0_8_,2,0x10);
            }
          }
          if ((ProString *)local_558._0_8_ != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)local_558._0_8_)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)local_558._0_8_)->d).d)->_M_i + -1;
            iVar2 = ((__atomic_base<int> *)&(((QString *)local_558._0_8_)->d).d)->_M_i;
            UNLOCK();
            pPVar17 = (ProString *)local_558._0_8_;
            goto joined_r0x001d796f;
          }
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_LFLAGS_VERSION");
      bVar11 = QMakeProject::isEmpty(pQVar24,(ProKey *)local_2d8);
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
      if (!bVar11) {
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_738,"QMAKE_LFLAGS_VERSION");
        QMakeEvaluator::first
                  ((ProString *)&local_6f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_738);
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_68,"VER_MAJ");
        QMakeEvaluator::first
                  ((ProString *)local_778,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_68);
        ProString::ProString((ProString *)local_608,(ProString *)&local_6f8);
        ProString::ProString(local_5d8,(ProString *)local_778);
        ProString::ProString((ProString *)local_558,(ProString *)local_608);
        ProString::ProString(&local_528,local_5d8);
        local_4f8 = (char (*) [2])0x2b73ae;
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_c8,"VER_MIN");
        QMakeEvaluator::first(&local_98,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_c8);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_4a8,
                         (QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                         local_558,&local_98);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_3c8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_4a8);
        local_330 = (Data *)0x2b73ae;
        pQVar24 = *ppQVar1;
        ProKey::ProKey((ProKey *)&local_128,"VER_PAT");
        QMakeEvaluator::first(&local_f8,&pQVar24->super_QMakeEvaluator,(ProKey *)&local_128);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_2d8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)local_3c8);
        local_240._0_8_ = local_330;
        ProString::ProString((ProString *)(local_240 + 8),&local_f8);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::convertTo<QString>
                  (&local_188.m_string,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)local_2d8);
        ProString::ProString((ProString *)&local_688,&local_188.m_string);
        pQVar24 = *ppQVar1;
        ProKey::ProKey(&local_158,"QMAKE_LFLAGS");
        pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,&local_158)->
                   super_QList<ProString>;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)&local_688)
        ;
        QList<ProString>::end(pQVar14);
        if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_688.a.a.a.a != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)*local_688.a.a.a.a)->d).d =
               *(int *)&(((QString *)*local_688.a.a.a.a)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)*local_688.a.a.a.a)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_688.a.a.a.a,2,0x10);
          }
        }
        if (&(local_188.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_188.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_188.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_2d8);
        if (&(local_f8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_f8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_f8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_128.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_128.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_3c8);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)local_4a8);
        if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)local_558);
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)local_608);
        if ((QArrayData *)local_778._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_778._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_778._0_8_,2,0x10);
          }
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)local_6f8.a.a.a != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)*local_6f8.a.a.a)->d).d =
               *(int *)&(((QString *)*local_6f8.a.a.a)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)*local_6f8.a.a.a)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_6f8.a.a.a,2,0x10);
          }
        }
        if ((QArrayData *)local_738.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)*local_738.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_738.a.a,2,0x10);
          }
        }
      }
    }
    pQVar24 = *ppQVar1;
    pcVar23 = "QMAKE_LFLAGS_SONAME";
  }
  else {
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CFLAGS_APP");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
    pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
    pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
               pPVar17 + (pPVar15->super_QList<ProString>).d.size);
    if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_3c8._0_8_)->d).d =
           *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_2d8._0_8_)->d).d =
           *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CXXFLAGS_APP");
    pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
    pQVar24 = *ppQVar1;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
    pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
    pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
               pPVar17 + (pPVar15->super_QList<ProString>).d.size);
    if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_3c8._0_8_)->d).d =
           *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_2d8._0_8_)->d).d =
           *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
      }
    }
    pQVar24 = *ppQVar1;
    pcVar23 = "QMAKE_LFLAGS_APP";
  }
  ProKey::ProKey((ProKey *)local_2d8,pcVar23);
  pPVar15 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_2d8);
  pQVar24 = *ppQVar1;
  ProKey::ProKey((ProKey *)local_3c8,"QMAKE_LFLAGS");
  pPVar22 = QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8);
  pPVar17 = (pPVar15->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar22,pPVar17,
             pPVar17 + (pPVar15->super_QList<ProString>).d.size);
  if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_3c8._0_8_)->d).d = *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_2d8._0_8_)->d).d = *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
    }
  }
LAB_001d7e84:
  if (this->include_deps == true) {
    pQVar24 = *ppQVar1;
    QVar39.m_data = (storage_type *)0xe;
    QVar39.m_size = (qsizetype)local_2d8;
    QString::fromUtf8(QVar39);
    uVar4 = local_2d8._0_8_;
    config_16.m_data = (storage_type_conflict *)local_2d8._8_8_;
    config_16.m_size = local_2d8._16_8_;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar24->super_QMakeEvaluator,config_16,false);
    if ((ProString *)uVar4 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)uVar4)->d).d = *(int *)&(((QString *)uVar4)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)uVar4)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (bVar11) {
      local_2d8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_2d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_2d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_2d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_2d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ProString::ProString((ProString *)local_2d8,"-MD");
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CFLAGS");
      pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8)->
                 super_QList<ProString>;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_2d8);
      QList<ProString>::end(pQVar14);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      pQVar24 = *ppQVar1;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_CXXFLAGS");
      pQVar14 = &QMakeEvaluator::valuesRef(&pQVar24->super_QMakeEvaluator,(ProKey *)local_3c8)->
                 super_QList<ProString>;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)pQVar14,(pQVar14->d).size,(ProString *)local_2d8);
      QList<ProString>::end(pQVar14);
      if ((ProString *)local_3c8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_3c8._0_8_)->d).d =
             *(int *)&(((QString *)local_3c8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_3c8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_2d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_2d8._0_8_)->d).d =
             *(int *)&(((QString *)local_2d8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2d8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8._0_8_,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnixMakefileGenerator::init2()
{
    if(project->isEmpty("QMAKE_FRAMEWORK_VERSION"))
        project->values("QMAKE_FRAMEWORK_VERSION").append(project->first("VER_MAJ"));

    if (project->first("TEMPLATE") == "aux") {
        project->values("PRL_TARGET") = {
            project->first("QMAKE_PREFIX_STATICLIB") +
            project->first("TARGET")
        };
    } else if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if(!project->isEmpty("QMAKE_BUNDLE")) {
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            project->values("TARGET").first().prepend(project->first("QMAKE_BUNDLE") + bundle_loc);
        }
        if(!project->isEmpty("TARGET"))
            project->values("TARGET").first().prepend(project->first("DESTDIR"));
    } else if (project->isActiveConfig("staticlib")) {
        project->values("PRL_TARGET") =
            project->values("TARGET").first().prepend(project->first("QMAKE_PREFIX_STATICLIB"));
        project->values("TARGET").first() += "." + project->first("QMAKE_EXTENSION_STATICLIB");
        if(project->values("QMAKE_AR_CMD").isEmpty())
            project->values("QMAKE_AR_CMD").append("$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
    } else {
        project->values("TARGETA").append(project->first("DESTDIR") + project->first("QMAKE_PREFIX_STATICLIB")
                + project->first("TARGET") + "." + project->first("QMAKE_EXTENSION_STATICLIB"));

        ProStringList &ar_cmd = project->values("QMAKE_AR_CMD");
        if (!ar_cmd.isEmpty())
            ar_cmd[0] = ar_cmd.at(0).toQString().replace(QLatin1String("(TARGET)"), QLatin1String("(TARGETA)"));
        else
            ar_cmd.append("$(AR) $(TARGETA) $(OBJECTS)");
        if (!project->isEmpty("QMAKE_BUNDLE")) {
            project->values("PRL_TARGET").prepend(project->first("QMAKE_BUNDLE") +
                "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION") +
                "/Resources/" + project->first("TARGET"));
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            const QString target = project->first("QMAKE_BUNDLE") +
                                        bundle_loc + project->first("TARGET");
            project->values("TARGET_").append(target);
            if (!project->isActiveConfig("shallow_bundle")) {
                project->values("TARGET_x.y").append(project->first("QMAKE_BUNDLE") +
                                                          "/Versions/" +
                                                          project->first("QMAKE_FRAMEWORK_VERSION") +
                                                          bundle_loc + project->first("TARGET"));
            } else {
                project->values("TARGET_x.y").append(target);
            }
        } else if(project->isActiveConfig("plugin")) {
            QString prefix;
            if(!project->isActiveConfig("no_plugin_name_prefix"))
                prefix = "lib";
            project->values("PRL_TARGET").prepend(prefix + project->first("TARGET"));
            project->values("TARGET_x.y.z").append(prefix +
                                                        project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            else
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN") +
                                                        "." + project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else if (!project->isEmpty("QMAKE_HPUX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + ".sl");
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append("lib" + project->first("VER_MAJ") + "." +
                                                        project->first("TARGET"));
            else
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x");
        } else if (!project->isEmpty("QMAKE_AIX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append(project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET")
                    + "." + project->first("QMAKE_EXTENSION_STATICLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB") +
                                                          "." + project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT"));
            }
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + "." +
                                                   project->first("QMAKE_EXTENSION_SHLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                      project->first("QMAKE_EXTENSION_SHLIB")
                                                      + "." + project->first("VER_MAJ") +
                                                      "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") +
                                                            "." +
                                                            project->first(
                                                                "QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT"));
            }
            if (project->isActiveConfig("unversioned_libname"))
                project->values("TARGET") = project->values("TARGET_");
            else
                project->values("TARGET") = project->values("TARGET_x.y.z");
        }
        if (!project->values("QMAKE_LFLAGS_SONAME").isEmpty()) {
            ProString soname;
            if(project->isActiveConfig("plugin")) {
                if(!project->values("TARGET").isEmpty())
                    soname += project->first("TARGET");
            } else if(!project->isEmpty("QMAKE_BUNDLE")) {
                soname += project->first("TARGET_x.y");
            } else if(project->isActiveConfig("unversioned_soname")) {
                soname = "lib" + project->first("QMAKE_ORIG_TARGET")
                    + "." + project->first("QMAKE_EXTENSION_SHLIB");
            } else if(!project->values("TARGET_x").isEmpty()) {
                soname += project->first("TARGET_x");
            }
            if(!soname.isEmpty()) {
                if(project->isActiveConfig("absolute_library_soname") &&
                   project->values("INSTALLS").indexOf("target") != -1 &&
                   !project->isEmpty("target.path")) {
                    QString instpath = Option::fixPathToTargetOS(project->first("target.path").toQString());
                    if(!instpath.endsWith(Option::dir_sep))
                        instpath += Option::dir_sep;
                    soname.prepend(instpath);
                } else if (!project->isEmpty("QMAKE_SONAME_PREFIX")) {
                    QString sonameprefix = project->first("QMAKE_SONAME_PREFIX").toQString();
                    if (!sonameprefix.startsWith('@'))
                        sonameprefix = Option::fixPathToTargetOS(sonameprefix, false);
                    if (!sonameprefix.endsWith(Option::dir_sep))
                        sonameprefix += Option::dir_sep;
                    soname.prepend(sonameprefix);
                }
                project->values("QMAKE_LFLAGS_SONAME").first() += escapeFilePath(soname);
            }
        }
        if (project->values("QMAKE_LINK_SHLIB_CMD").isEmpty())
            project->values("QMAKE_LINK_SHLIB_CMD").append(
                "$(LINK) $(LFLAGS) " + project->first("QMAKE_LINK_O_FLAG") + "$(TARGET) $(OBJECTS) $(LIBS) $(OBJCOMP)");
    }
    if (!project->values("QMAKE_APP_FLAG").isEmpty() || project->first("TEMPLATE") == "aux") {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
            if (project->isActiveConfig("plugin_with_soname"))
                project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
            if(!project->isEmpty("QMAKE_LFLAGS_COMPAT_VERSION")) {
                if(project->isEmpty("COMPAT_VERSION"))
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("VER_MAJ") + "." +
                                                                    project->first("VER_MIN"));
                else
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("COMPATIBILITY_VERSION"));
            }
            if(!project->isEmpty("QMAKE_LFLAGS_VERSION")) {
                project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_VERSION") +
                                                                project->first("VER_MAJ") + "." +
                                                                project->first("VER_MIN") + "." +
                                                                project->first("VER_PAT"));
            }
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        }
    }

    if (include_deps && project->isActiveConfig("gcc_MD_depends")) {
        ProString MD_flag("-MD");
        project->values("QMAKE_CFLAGS") += MD_flag;
        project->values("QMAKE_CXXFLAGS") += MD_flag;
    }
}